

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawPolygonDecal
          (PixelGameEngine *this,Decal *decal,
          vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *pos,
          vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *uv,Pixel tint)

{
  pointer pvVar1;
  uint32_t i;
  ulong uVar2;
  float fVar3;
  float fVar4;
  value_type local_90;
  
  local_90.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_90.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_90.uv.super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.uv.super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.pos.
  super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.uv.super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.pos.
  super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.pos.
  super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = (long)(pos->
                super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pos->
                super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_90.points = (uint32_t)uVar2;
  local_90.mode = NORMAL;
  local_90.decal = decal;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            (&local_90.pos,uVar2 & 0xffffffff);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            (&local_90.uv,(ulong)local_90.points);
  std::vector<float,_std::allocator<float>_>::resize(&local_90.w,(ulong)local_90.points);
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::resize
            (&local_90.tint,(ulong)local_90.points);
  for (uVar2 = 0; uVar2 < local_90.points; uVar2 = uVar2 + 1) {
    pvVar1 = (pos->
             super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    fVar3 = pvVar1[uVar2].x * (this->vInvScreenSize).x;
    fVar4 = pvVar1[uVar2].y * (this->vInvScreenSize).y;
    local_90.pos.
    super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2].x = fVar3 + fVar3 + -1.0;
    local_90.pos.
    super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2].y = -(fVar4 + fVar4 + -1.0);
    local_90.uv.
    super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] =
         (uv->super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
         )._M_impl.super__Vector_impl_data._M_start[uVar2];
    local_90.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2].field_0.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)tint.field_0;
    local_90.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = 1.0;
  }
  local_90.mode = this->nDecalMode;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             &local_90);
  DecalInstance::~DecalInstance(&local_90);
  return;
}

Assistant:

void PixelGameEngine::DrawPolygonDecal(olc::Decal *decal, const std::vector<olc::vf2d> &pos, const std::vector<olc::vf2d> &uv, const olc::Pixel tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.points = uint32_t(pos.size());
		di.pos.resize(di.points);
		di.uv.resize(di.points);
		di.w.resize(di.points);
		di.tint.resize(di.points);
		for (uint32_t i = 0; i < di.points; i++)
		{
			di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			di.uv[i] = uv[i];
			di.tint[i] = tint;
			di.w[i] = 1.0f;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}